

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void cancel_item(obj *obj)

{
  short sVar1;
  obj *poVar2;
  char cVar3;
  boolean bVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char buf [256];
  char acStack_128 [264];
  
  bVar7 = uleft == obj;
  bVar8 = uright == obj;
  sVar1 = obj->otyp;
  bVar9 = true;
  if (sVar1 == 0x14f) {
    bVar9 = (obj->field_0x4a & 2) == 0;
  }
  switch(sVar1) {
  case 0x92:
    if (((obj->owornmask & 0x10) != 0) && (uarmg == obj)) {
LAB_00291e89:
      u.abon.a[3] = u.abon.a[3] - obj->spe;
LAB_00291f19:
      iflags.botl = '\x01';
    }
    break;
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
    break;
  case 0x9d:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.abon.a[5] = u.abon.a[5] - obj->spe;
      goto LAB_00291f19;
    }
    break;
  case 0x9e:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.abon.a[0] = u.abon.a[0] - obj->spe;
      goto LAB_00291f19;
    }
    break;
  case 0x9f:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.abon.a[4] = u.abon.a[4] - obj->spe;
      goto LAB_00291f19;
    }
    break;
  case 0xa0:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      goto LAB_00291f19;
    }
    break;
  case 0xa1:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      cVar3 = obj->spe;
LAB_00291f13:
      u.abon.a[2] = u.abon.a[2] - cVar3;
      goto LAB_00291f19;
    }
    break;
  case 0xa2:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) goto LAB_00291e89;
    break;
  case 0xa3:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.uhitinc = u.uhitinc - obj->spe;
    }
    break;
  case 0xa4:
    if ((obj->owornmask & 0x60000) != 0 && (bVar7 || bVar8)) {
      u.udaminc = u.udaminc - obj->spe;
    }
    break;
  default:
    if (((sVar1 == 0x51) && ((obj->owornmask & 4) != 0)) && (uarmh == obj)) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      cVar3 = obj->spe;
      goto LAB_00291f13;
    }
  }
  bVar4 = equip_is_worn(obj);
  poVar2 = uarm;
  if ((bVar4 != '\0') && (obj->spe != '\0')) {
    if ((obj->oprops & 0x100) != 0) {
      u.abon.a[3] = u.abon.a[3] - obj->spe;
      iflags.botl = '\x01';
    }
    if ((obj->oprops & 0x200) != 0) {
      u.abon.a[1] = u.abon.a[1] - obj->spe;
      u.abon.a[2] = u.abon.a[2] - obj->spe;
      iflags.botl = '\x01';
    }
  }
  if ((ushort)(obj->otyp - 0x54U) < 0xb) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar5 = Shk_Your(acStack_128,obj);
      pcVar6 = xname(obj);
      pline("%s %s reverts to its natural form!",pcVar5,pcVar6);
LAB_00292033:
      costly_cancel(obj);
      if (poVar2 != obj) {
        obj->otyp = obj->otyp + 0xb;
        goto LAB_0029206a;
      }
      setworn((obj *)0x0,1);
    }
    else {
      if (uarm == obj) {
        pline("Your armor feels looser.");
        goto LAB_00292033;
      }
      costly_cancel(obj);
    }
    obj->otyp = obj->otyp + 0xb;
    if (poVar2 == obj) {
      setworn(obj,1);
    }
  }
LAB_0029206a:
  sVar1 = obj->otyp;
  if ((((objects[sVar1].field_0x10 & 0x10) != 0) ||
      (((obj->spe != '\0' &&
        (((byte)obj->oclass - 2 < 2 || ((obj->oclass == 6 && (objects[sVar1].oc_subtyp != '\0'))))))
       || (sVar1 == 0x141)))) || (sVar1 == 0x13f)) {
    if ((((obj->spe != -(obj->oclass == '\v')) && (sVar1 != 0xe9)) && (sVar1 != 0x10b)) &&
       (sVar1 != 0x1ca)) {
      costly_cancel(obj);
      obj->spe = -(obj->oclass == '\v');
    }
    cVar3 = obj->oclass;
    if (cVar3 == '\b') {
      costly_cancel(obj);
      sVar1 = obj->otyp;
      if (sVar1 != 0x130) {
        if (sVar1 == 0x151) {
          obj->otyp = 0x150;
          goto LAB_002921a5;
        }
        if (sVar1 != 0x13f) {
          obj->otyp = 0x14f;
          obj->field_0x4b = obj->field_0x4b & 0xfc;
          goto LAB_002921a5;
        }
      }
      obj->otyp = 0x140;
    }
    else if (cVar3 == '\n') {
      if ((obj->otyp != 0x1a1) && (obj->otyp != 0x1bd)) {
        costly_cancel(obj);
        obj->otyp = 0x1bc;
      }
    }
    else if (cVar3 == '\t') {
      costly_cancel(obj);
      obj->otyp = 0x17c;
      obj->spe = '\0';
    }
  }
LAB_002921a5:
  if (!bVar9) {
    costly_cancel(obj);
  }
  unbless(obj);
  uncurse(obj);
  return;
}

Assistant:

void cancel_item(struct obj *obj)
{
	boolean	u_ring = (obj == uleft) || (obj == uright);
	boolean holy = (obj->otyp == POT_WATER && obj->blessed);

	switch(obj->otyp) {
		case RIN_GAIN_STRENGTH:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_STR) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_CONSTITUTION:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CON) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_INTELLIGENCE:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_INT) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_WISDOM:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_GAIN_DEXTERITY:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_ADORNMENT:
			if ((obj->owornmask & W_RING) && u_ring) {
				ABON(A_CHA) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case RIN_INCREASE_ACCURACY:
			if ((obj->owornmask & W_RING) && u_ring)
				u.uhitinc -= obj->spe;
			break;
		case RIN_INCREASE_DAMAGE:
			if ((obj->owornmask & W_RING) && u_ring)
				u.udaminc -= obj->spe;
			break;
		case GAUNTLETS_OF_DEXTERITY:
			if ((obj->owornmask & W_ARMG) && (obj == uarmg)) {
				ABON(A_DEX) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		case HELM_OF_BRILLIANCE:
			if ((obj->owornmask & W_ARMH) && (obj == uarmh)) {
				ABON(A_INT) -= obj->spe;
				ABON(A_WIS) -= obj->spe;
				iflags.botl = 1;
			}
			break;
		/* case RIN_PROTECTION:  not needed */
	}

	if (equip_is_worn(obj) && obj->spe) {
	    if (obj->oprops & ITEM_DEXTERITY) {
		ABON(A_DEX) -= obj->spe;
		iflags.botl = 1;
	    }

	    if (obj->oprops & ITEM_BRILLIANCE) {
		ABON(A_INT) -= obj->spe;
		ABON(A_WIS) -= obj->spe;
		iflags.botl = 1;
	    }
	}

	/* MRKR: Cancelled *DSM reverts to scales.  */
	/*       Suggested by Daniel Morris in RGRN */

	if (obj->otyp >= GRAY_DRAGON_SCALE_MAIL &&
	    obj->otyp <= CHROMATIC_DRAGON_SCALE_MAIL) {
		/* dragon scale mail reverts to dragon scales */
		boolean worn = (obj == uarm);

		if (!Blind) {
			char buf[BUFSZ];
			pline("%s %s reverts to its natural form!",
			      Shk_Your(buf, obj), xname(obj));
		} else if (worn) {
			pline("Your armor feels looser.");
		}
		costly_cancel(obj);

		if (worn)
			setworn(NULL, W_ARM);

		/* assumes same order */
		obj->otyp = GRAY_DRAGON_SCALES +
			    obj->otyp - GRAY_DRAGON_SCALE_MAIL;

		if (worn)
			setworn(obj, W_ARM);
	}

	if (objects[obj->otyp].oc_magic
	    || (obj->spe && (obj->oclass == ARMOR_CLASS ||
			     obj->oclass == WEAPON_CLASS || is_weptool(obj)))
	    || obj->otyp == POT_ACID || obj->otyp == POT_SICKNESS) {
	    if (obj->spe != ((obj->oclass == WAND_CLASS) ? -1 : 0) &&
	       obj->otyp != WAN_CANCELLATION &&
		 /* can't cancel cancellation */
		 obj->otyp != MAGIC_LAMP &&
		 obj->otyp != CANDELABRUM_OF_INVOCATION) {
		costly_cancel(obj);
		obj->spe = (obj->oclass == WAND_CLASS) ? -1 : 0;
	    }
	    switch (obj->oclass) {
	      case SCROLL_CLASS:
		costly_cancel(obj);
		obj->otyp = SCR_BLANK_PAPER;
		obj->spe = 0;
		break;
	      case SPBOOK_CLASS:
		if (obj->otyp != SPE_CANCELLATION &&
			obj->otyp != SPE_BOOK_OF_THE_DEAD) {
		    costly_cancel(obj);
		    obj->otyp = SPE_BLANK_PAPER;
		}
		break;
	      case POTION_CLASS:
		costly_cancel(obj);
		if (obj->otyp == POT_SICKNESS ||
		    obj->otyp == POT_SEE_INVISIBLE) {
	    /* sickness is "biologically contaminated" fruit juice; cancel it
	     * and it just becomes fruit juice... whereas see invisible
	     * tastes like "enchanted" fruit juice, it similarly cancels.
	     */
		    obj->otyp = POT_FRUIT_JUICE;
		} else if (obj->otyp == POT_VAMPIRE_BLOOD) {
		    obj->otyp = POT_BLOOD;
		} else {
	            obj->otyp = POT_WATER;
		    obj->odiluted = 0; /* same as any other water */
		}
		break;
	    }
	}
	if (holy) costly_cancel(obj);
	unbless(obj);
	uncurse(obj);
#ifdef INVISIBLE_OBJECTS
	if (obj->oinvis) obj->oinvis = 0;
#endif
	return;
}